

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O1

void __thiscall QGraphicsWidgetPrivate::~QGraphicsWidgetPrivate(QGraphicsWidgetPrivate *this)

{
  Data *pDVar1;
  QMarginsF *pQVar2;
  WindowData *__ptr;
  
  (this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate =
       (_func_int **)&PTR__QGraphicsWidgetPrivate_00823008;
  pDVar1 = (this->actions).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->actions).d.d)->super_QArrayData,8,0x10);
    }
  }
  pQVar2 = (this->windowFrameMargins)._M_t.
           super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
           super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
           super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl;
  if (pQVar2 != (QMarginsF *)0x0) {
    operator_delete(pQVar2,0x20);
  }
  (this->windowFrameMargins)._M_t.super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>.
  _M_t.super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
  super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl = (QMarginsF *)0x0;
  __ptr = (this->windowData)._M_t.
          super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
          ._M_t.
          super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
          .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
  if (__ptr != (WindowData *)0x0) {
    std::default_delete<QGraphicsWidgetPrivate::WindowData>::operator()
              ((default_delete<QGraphicsWidgetPrivate::WindowData> *)&this->windowData,__ptr);
  }
  (this->windowData)._M_t.
  super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
  ._M_t.
  super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
  .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl =
       (WindowData *)0x0;
  QFont::~QFont(&this->font);
  QPalette::~QPalette(&this->palette);
  pQVar2 = (this->margins)._M_t.super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>.
           _M_t.super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
           super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl;
  if (pQVar2 != (QMarginsF *)0x0) {
    operator_delete(pQVar2,0x20);
  }
  (this->margins)._M_t.super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
  super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
  super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl = (QMarginsF *)0x0;
  QGraphicsItemPrivate::~QGraphicsItemPrivate(&this->super_QGraphicsItemPrivate);
  return;
}

Assistant:

QGraphicsWidgetPrivate::~QGraphicsWidgetPrivate()
{
}